

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ditImageCompareTests.cpp
# Opt level: O3

int __thiscall dit::ImageCompareTests::init(ImageCompareTests *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  TestNode *pTVar1;
  
  pTVar1 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar1,(this->super_TestCaseGroup).super_TestNode.m_testCtx,
             "fuzzy_metric","Fuzzy comparison metrics");
  pTVar1->_vptr_TestNode = (_func_int **)&PTR__TestCase_00270bb0;
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar1,(this->super_TestCaseGroup).super_TestNode.m_testCtx,
             "bilinear_compare","Bilinear Image Comparison Tests");
  pTVar1->_vptr_TestNode = (_func_int **)&PTR__TestCase_00270c50;
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  return extraout_EAX;
}

Assistant:

void ImageCompareTests::init (void)
{
	addChild(new FuzzyComparisonMetricTests	(m_testCtx));
	addChild(new BilinearCompareTests		(m_testCtx));
}